

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int lyd_print_file(FILE *f,lyd_node *root,LYD_FORMAT format,int options)

{
  undefined1 local_70 [8];
  lyout out;
  int r;
  int options_local;
  LYD_FORMAT format_local;
  lyd_node *root_local;
  FILE *f_local;
  
  if (f == (FILE *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_print_file");
    f_local._4_4_ = 1;
  }
  else {
    memset(local_70,0,0x40);
    local_70._0_4_ = LYOUT_STREAM;
    out._0_8_ = f;
    out.hole_count._4_4_ = lyd_print_((lyout *)local_70,root,format,options);
    free((void *)out.method.mem.size);
    f_local._4_4_ = out.hole_count._4_4_;
  }
  return f_local._4_4_;
}

Assistant:

API int
lyd_print_file(FILE *f, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    int r;
    struct lyout out;

    if (!f) {
        LOGARG;
        return EXIT_FAILURE;
    }

    memset(&out, 0, sizeof out);

    out.type = LYOUT_STREAM;
    out.method.f = f;

    r = lyd_print_(&out, root, format, options);

    free(out.buffered);
    return r;
}